

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::createExtra(QWidgetPrivate *this)

{
  undefined1 *puVar1;
  QWExtra *pQVar2;
  pointer __p_00;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *this_00;
  pointer __p;
  long in_FS_OFFSET;
  __uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
      super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl == (QWExtra *)0x0) {
    this_00 = &this->extra;
    __p_00 = (pointer)operator_new(0x80);
    __p_00->glContext = (void *)0x0;
    (__p_00->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
    super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
    super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl = (QTLWExtra *)0x0;
    __p_00->proxyWidget = (QGraphicsProxyWidget *)0x0;
    (__p_00->curs)._M_t.super___uniq_ptr_impl<QCursor,_std::default_delete<QCursor>_>._M_t.
    super__Tuple_impl<0UL,_QCursor_*,_std::default_delete<QCursor>_>.
    super__Head_base<0UL,_QCursor_*,_false>._M_head_impl = (QCursor *)0x0;
    (__p_00->style).wp.d = (Data *)0x0;
    (__p_00->style).wp.value = (QObject *)0x0;
    (__p_00->focus_proxy).wp.d = (Data *)0x0;
    (__p_00->focus_proxy).wp.value = (QObject *)0x0;
    (__p_00->mask).d = (QRegionData *)0x0;
    (__p_00->styleSheet).d.d = (Data *)0x0;
    (__p_00->styleSheet).d.ptr = (char16_t *)0x0;
    (__p_00->styleSheet).d.size = 0;
    __p_00->minw = 0;
    __p_00->minh = 0;
    __p_00->maxw = 0;
    __p_00->maxh = 0;
    __p_00->customDpiX = 0;
    __p_00->customDpiY = 0;
    (__p_00->staticContentsSize).wd = 0;
    *(undefined8 *)&(__p_00->staticContentsSize).ht = 0;
    QRegion::QRegion(&__p_00->mask);
    (__p_00->styleSheet).d.size = 0;
    (__p_00->styleSheet).d.d = (Data *)0x0;
    (__p_00->styleSheet).d.ptr = (char16_t *)0x0;
    (__p_00->staticContentsSize).wd = -1;
    (__p_00->staticContentsSize).ht = -1;
    local_30._M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
    super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl =
         (tuple<QWExtra_*,_std::default_delete<QWExtra>_>)
         (_Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>)0x0;
    std::__uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>::reset
              ((__uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_> *)this_00,__p_00);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::~unique_ptr
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)&local_30);
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->glContext = (void *)0x0;
    ((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
     super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
     super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->proxyWidget =
         (QGraphicsProxyWidget *)0x0;
    pQVar2 = (this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    pQVar2->minw = 0;
    pQVar2->minh = 0;
    pQVar2->maxw = 0xffffff;
    pQVar2->maxh = 0xffffff;
    pQVar2->customDpiX = 0;
    pQVar2->customDpiY = 0;
    pQVar2->field_0x7c = pQVar2->field_0x7c & 0xfc;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfff3;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffef;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffdf;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xffbf;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfeff;
    puVar1 = &((this_00->_M_t).super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xff7f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::createExtra()
{
    if (!extra) {                                // if not exists
        extra = std::make_unique<QWExtra>();
        extra->glContext = nullptr;
#if QT_CONFIG(graphicsview)
        extra->proxyWidget = nullptr;
#endif
        extra->minw = 0;
        extra->minh = 0;
        extra->maxw = QWIDGETSIZE_MAX;
        extra->maxh = QWIDGETSIZE_MAX;
        extra->customDpiX = 0;
        extra->customDpiY = 0;
        extra->explicitMinSize = 0;
        extra->explicitMaxSize = 0;
        extra->autoFillBackground = 0;
        extra->nativeChildrenForced = 0;
        extra->inRenderWithPainter = 0;
        extra->hasWindowContainer = false;
        extra->hasMask = 0;
        createSysExtra();
#ifdef QWIDGET_EXTRA_DEBUG
        static int count = 0;
        qDebug() << "extra" << ++count;
#endif
    }
}